

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkUniversal.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkUniversal::ConstraintsBiLoad_C
          (ChLinkUniversal *this,double factor,double recovery_clamp,bool do_clamp)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar6 [32];
  undefined1 auVar5 [32];
  
  iVar1 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar1 != '\0') {
    auVar3._0_8_ = factor * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
                            .m_storage.m_data.array[0];
    auVar3._8_8_ = factor * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
                            .m_storage.m_data.array[1];
    auVar3._16_8_ =
         factor * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                  .m_data.array[2];
    auVar3._24_8_ =
         factor * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                  .m_data.array[3];
    if (do_clamp) {
      auVar4._8_8_ = recovery_clamp;
      auVar4._0_8_ = recovery_clamp;
      auVar5._16_8_ = recovery_clamp;
      auVar5._0_16_ = auVar4;
      auVar5._24_8_ = recovery_clamp;
      auVar2._8_8_ = 0x8000000000000000;
      auVar2._0_8_ = 0x8000000000000000;
      auVar2 = vxorpd_avx512vl(auVar4,auVar2);
      auVar6._0_8_ = auVar2._0_8_;
      auVar6._8_8_ = auVar6._0_8_;
      auVar6._16_8_ = auVar6._0_8_;
      auVar6._24_8_ = auVar6._0_8_;
      auVar3 = vmaxpd_avx(auVar3,auVar6);
      auVar3 = vminpd_avx(auVar3,auVar5);
    }
    (this->m_cnstr_x).super_ChConstraintTwo.super_ChConstraint.b_i =
         auVar3._0_8_ + (this->m_cnstr_x).super_ChConstraintTwo.super_ChConstraint.b_i;
    auVar2 = vshufpd_avx(auVar3._0_16_,auVar3._0_16_,1);
    (this->m_cnstr_y).super_ChConstraintTwo.super_ChConstraint.b_i =
         auVar2._0_8_ + (this->m_cnstr_y).super_ChConstraintTwo.super_ChConstraint.b_i;
    auVar2 = vshufpd_avx(auVar3._16_16_,auVar3._16_16_,1);
    (this->m_cnstr_z).super_ChConstraintTwo.super_ChConstraint.b_i =
         auVar3._16_8_ + (this->m_cnstr_z).super_ChConstraintTwo.super_ChConstraint.b_i;
    (this->m_cnstr_dot).super_ChConstraintTwo.super_ChConstraint.b_i =
         auVar2._0_8_ + (this->m_cnstr_dot).super_ChConstraintTwo.super_ChConstraint.b_i;
  }
  return;
}

Assistant:

void ChLinkUniversal::ConstraintsBiLoad_C(double factor, double recovery_clamp, bool do_clamp) {
    if (!IsActive())
        return;

    double cnstr_x_violation = factor * m_C(0);
    double cnstr_y_violation = factor * m_C(1);
    double cnstr_z_violation = factor * m_C(2);
    double cnstr_dot_violation = factor * m_C(3);

    if (do_clamp) {
        cnstr_x_violation = ChMin(ChMax(cnstr_x_violation, -recovery_clamp), recovery_clamp);
        cnstr_y_violation = ChMin(ChMax(cnstr_y_violation, -recovery_clamp), recovery_clamp);
        cnstr_z_violation = ChMin(ChMax(cnstr_z_violation, -recovery_clamp), recovery_clamp);
        cnstr_dot_violation = ChMin(ChMax(cnstr_dot_violation, -recovery_clamp), recovery_clamp);
    }

    m_cnstr_x.Set_b_i(m_cnstr_x.Get_b_i() + cnstr_x_violation);
    m_cnstr_y.Set_b_i(m_cnstr_y.Get_b_i() + cnstr_y_violation);
    m_cnstr_z.Set_b_i(m_cnstr_z.Get_b_i() + cnstr_z_violation);
    m_cnstr_dot.Set_b_i(m_cnstr_dot.Get_b_i() + cnstr_dot_violation);
}